

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger-inl.h
# Opt level: O1

int __thiscall
spdlog::async_logger::clone
          (async_logger *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  shared_ptr<spdlog::async_logger> cloned;
  undefined1 local_39;
  async_logger *local_38;
  _Alloc_hider a_Stack_30 [2];
  
  local_38 = (async_logger *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<spdlog::async_logger,std::allocator<spdlog::async_logger>,spdlog::async_logger&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)a_Stack_30,&local_38,
             (allocator<spdlog::async_logger> *)&local_39,(async_logger *)__fn);
  std::__shared_ptr<spdlog::async_logger,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<spdlog::async_logger,spdlog::async_logger>
            ((__shared_ptr<spdlog::async_logger,(__gnu_cxx::_Lock_policy)2> *)&local_38,local_38);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(local_38->super_logger).name_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__child_stack);
  (this->super_logger).name_._M_dataplus._M_p = (pointer)0x0;
  (this->super_logger)._vptr_logger = (_func_int **)local_38;
  (this->super_logger).name_._M_dataplus._M_p = a_Stack_30[0]._M_p;
  return (int)this;
}

Assistant:

SPDLOG_INLINE std::shared_ptr<spdlog::logger> spdlog::async_logger::clone(std::string new_name) {
    auto cloned = std::make_shared<spdlog::async_logger>(*this);
    cloned->name_ = std::move(new_name);
    return cloned;
}